

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<Fad<Fad<double>_>_>::TPZVec(TPZVec<Fad<Fad<double>_>_> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  Fad<Fad<double>_> *pFVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  Fad<Fad<double>_> *this_00;
  
  *in_RDI = &PTR__TPZVec_025a3440;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<Fad<Fad<double>>>::TPZVec(const int64_t) [T = Fad<Fad<double>>]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (0 < (long)in_RSI) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x58),0);
      uVar5 = uVar2 + 8;
      if (SUB168(auVar1 * ZEXT816(0x58),8) != 0 || 0xfffffffffffffff7 < uVar2) {
        uVar5 = 0xffffffffffffffff;
      }
      puVar3 = (ulong *)operator_new__(uVar5);
      *puVar3 = in_RSI;
      pFVar4 = (Fad<Fad<double>_> *)(puVar3 + 1);
      if (in_RSI != 0) {
        this_00 = pFVar4;
        do {
          Fad<Fad<double>_>::Fad(this_00);
          this_00 = this_00 + 1;
        } while (this_00 != pFVar4 + in_RSI);
      }
      in_RDI[1] = pFVar4;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}